

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::GetLevelParameterTest::iterate(GetLevelParameterTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 dVar6;
  int iVar7;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLuint i;
  long lVar9;
  float fVar10;
  float fVar11;
  undefined8 in_stack_fffffffffffffe08;
  uint uVar12;
  undefined8 in_stack_fffffffffffffe10;
  undefined4 uVar13;
  undefined8 in_stack_fffffffffffffe18;
  undefined4 uVar14;
  GLint result_dsa;
  GLint result_legacy;
  GLuint texture;
  GetLevelParameterTest *local_1c8;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  long lVar8;
  
  uVar13 = (undefined4)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  uVar12 = (uint)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  uVar14 = (undefined4)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x154);
  local_1c8 = this;
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar3) || (bVar4)) {
    texture = 0;
    (**(code **)(lVar8 + 0x6f8))(1);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1e11);
    (**(code **)(lVar8 + 0xb8))(0x806f,texture);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glBindTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1e14);
    (**(code **)(lVar8 + 0x1320))
              (0x806f,0,0x8058,4,4,4,(ulong)uVar12 << 0x20,CONCAT44(uVar13,0x1908),
               CONCAT44(uVar14,0x1401),s_texture_data);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glTexImage2D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1e18);
    (**(code **)(lVar8 + 0x1320))(0x806f,1,0x8058,2,2,2,0,0x1908,0x1401,s_texture_data);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glTexImage2D has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1e1c);
    bVar3 = true;
    for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
      for (lVar9 = 0; lVar9 != 0x3c; lVar9 = lVar9 + 4) {
        result_legacy = 0;
        result_dsa = 0;
        iVar2 = *(int *)((long)iterate::pnames + lVar9);
        (**(code **)(lVar8 + 0xab0))(0x806f,iVar5,iVar2,&result_legacy);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"glGetTexLevelParameteriv has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                        ,0x1e30);
        (**(code **)(lVar8 + 0xae8))(texture,iVar5,iVar2,&result_dsa);
        iVar7 = (**(code **)(lVar8 + 0x800))();
        if (iVar7 == 0) {
          if (result_legacy != result_dsa) {
            local_1b0._0_8_ = ((local_1c8->super_TestCase).m_context)->m_testCtx->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,"For parameter name ");
            local_1c0.m_getName = glu::getTextureLevelParameterName;
            local_1c0.m_value = iVar2;
            tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
            std::operator<<((ostream *)poVar1," GetTextureLevelParameteriv returned ");
            std::ostream::operator<<(poVar1,result_dsa);
            std::operator<<((ostream *)poVar1,
                            ", but reference value (queried using GetTexLevelParameteriv) was ");
            std::ostream::operator<<(poVar1,result_legacy);
            std::operator<<((ostream *)poVar1,". Test fails.");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00b2e5fa;
          }
        }
        else {
          local_1b0._0_8_ = ((local_1c8->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,
                          "GetTextureLevelParameteriv unexpectedly generated error ");
          local_1c0.m_getName = glu::getErrorName;
          local_1c0.m_value = iVar7;
          tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
          std::operator<<((ostream *)poVar1,". Test fails.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00b2e5fa:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          bVar3 = false;
        }
      }
    }
    for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
      for (lVar9 = 0; lVar9 != 0x3c; lVar9 = lVar9 + 4) {
        result_legacy = 0;
        result_dsa = 0;
        iVar2 = *(int *)((long)iterate::pnames + lVar9);
        (**(code **)(lVar8 + 0xaa8))(0x806f,iVar5,iVar2,&result_legacy);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"glGetTexLevelParameterfv has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                        ,0x1e5b);
        (**(code **)(lVar8 + 0xae0))(texture,iVar5,iVar2,&result_dsa);
        iVar7 = (**(code **)(lVar8 + 0x800))();
        if (iVar7 == 0) {
          fVar10 = (float)result_legacy - (float)result_dsa;
          fVar11 = -fVar10;
          if (-fVar10 <= fVar10) {
            fVar11 = fVar10;
          }
          if (0.125 < fVar11) {
            local_1b0._0_8_ = ((local_1c8->super_TestCase).m_context)->m_testCtx->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::operator<<((ostream *)poVar1,"For parameter name ");
            local_1c0.m_getName = glu::getTextureLevelParameterName;
            local_1c0.m_value = iVar2;
            tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
            std::operator<<((ostream *)poVar1," GetTextureLevelParameterfv returned ");
            std::ostream::operator<<(poVar1,(float)result_dsa);
            std::operator<<((ostream *)poVar1,
                            ", but reference value (queried using GetTexLevelParameterfv) was ");
            std::ostream::operator<<(poVar1,(float)result_legacy);
            std::operator<<((ostream *)poVar1,". Test fails.");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            goto LAB_00b2e7e0;
          }
        }
        else {
          local_1b0._0_8_ = ((local_1c8->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,
                          "GetTextureLevelParameterfv unexpectedly generated error ");
          local_1c0.m_getName = glu::getErrorName;
          local_1c0.m_value = iVar7;
          tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
          std::operator<<((ostream *)poVar1,". Test fails.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00b2e7e0:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
          bVar3 = false;
        }
      }
    }
    if (texture != 0) {
      (**(code **)(lVar8 + 0x480))(1);
    }
    do {
      iVar5 = (**(code **)(lVar8 + 0x800))();
    } while (iVar5 != 0);
    this_00 = (local_1c8->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar3) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (local_1c8->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetLevelParameterTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Objects. */
	glw::GLuint texture = 0;

	try
	{
		/* Texture initiation. */
		gl.genTextures(1, &texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		gl.bindTexture(GL_TEXTURE_3D, texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

		gl.texImage3D(GL_TEXTURE_3D, 0, GL_RGBA8, s_texture_width, s_texture_height, s_texture_depth, 0, GL_RGBA,
					  GL_UNSIGNED_BYTE, s_texture_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");

		gl.texImage3D(GL_TEXTURE_3D, 1, GL_RGBA8, s_texture_width / 2, s_texture_height / 2, s_texture_depth / 2, 0,
					  GL_RGBA, GL_UNSIGNED_BYTE, s_texture_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D has failed");

		static const glw::GLenum pnames[] = {
			GL_TEXTURE_WIDTH,	  GL_TEXTURE_HEIGHT,	 GL_TEXTURE_DEPTH,		 GL_TEXTURE_INTERNAL_FORMAT,
			GL_TEXTURE_RED_TYPE,   GL_TEXTURE_GREEN_TYPE, GL_TEXTURE_BLUE_TYPE,  GL_TEXTURE_ALPHA_TYPE,
			GL_TEXTURE_DEPTH_TYPE, GL_TEXTURE_RED_SIZE,   GL_TEXTURE_GREEN_SIZE, GL_TEXTURE_BLUE_SIZE,
			GL_TEXTURE_ALPHA_SIZE, GL_TEXTURE_DEPTH_SIZE, GL_TEXTURE_COMPRESSED
		};
		static const glw::GLuint pnames_count = sizeof(pnames) / sizeof(pnames[0]);

		/* Test GetTextureLevelParameteriv. */
		for (glw::GLuint i = 0; i < 2 /* levels */; ++i)
		{
			for (glw::GLuint j = 0; j < pnames_count; ++j)
			{
				glw::GLint result_legacy = 0;
				glw::GLint result_dsa	= 0;

				/* Quering reference value. */
				gl.getTexLevelParameteriv(GL_TEXTURE_3D, i, pnames[j], &result_legacy);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameteriv has failed");

				/* Quering using DSA function. */
				gl.getTextureLevelParameteriv(texture, i, pnames[j], &result_dsa);

				/* Check for errors. */
				glw::GLenum error = GL_NO_ERROR;

				if (GL_NO_ERROR != (error = gl.getError()))
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetTextureLevelParameteriv unexpectedly generated error "
						<< glu::getErrorStr(error) << ". Test fails." << tcu::TestLog::EndMessage;

					is_ok = false;
				}
				else
				{
					/* Compare values. */
					if (result_legacy != result_dsa)
					{
						m_context.getTestContext().getLog()
							<< tcu::TestLog::Message << "For parameter name "
							<< glu::getTextureLevelParameterStr(pnames[j]) << " GetTextureLevelParameteriv returned "
							<< result_dsa << ", but reference value (queried using GetTexLevelParameteriv) was "
							<< result_legacy << ". Test fails." << tcu::TestLog::EndMessage;

						is_ok = false;
					}
				}
			}
		}

		/* Test GetTextureLevelParameterfv. */
		for (glw::GLuint i = 0; i < 2 /* levels */; ++i)
		{
			for (glw::GLuint j = 0; j < pnames_count; ++j)
			{
				glw::GLfloat result_legacy = 0.f;
				glw::GLfloat result_dsa	= 0.f;

				/* Quering reference value. */
				gl.getTexLevelParameterfv(GL_TEXTURE_3D, i, pnames[j], &result_legacy);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexLevelParameterfv has failed");

				/* Quering using DSA function. */
				gl.getTextureLevelParameterfv(texture, i, pnames[j], &result_dsa);

				/* Check for errors. */
				glw::GLenum error = GL_NO_ERROR;

				if (GL_NO_ERROR != (error = gl.getError()))
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "GetTextureLevelParameterfv unexpectedly generated error "
						<< glu::getErrorStr(error) << ". Test fails." << tcu::TestLog::EndMessage;

					is_ok = false;
				}
				else
				{
					/* Compare values. */
					if (de::abs(result_legacy - result_dsa) > 0.125 /* Precision. */)
					{
						m_context.getTestContext().getLog()
							<< tcu::TestLog::Message << "For parameter name "
							<< glu::getTextureLevelParameterStr(pnames[j]) << " GetTextureLevelParameterfv returned "
							<< result_dsa << ", but reference value (queried using GetTexLevelParameterfv) was "
							<< result_legacy << ". Test fails." << tcu::TestLog::EndMessage;

						is_ok = false;
					}
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture)
	{
		gl.deleteTextures(1, &texture);
	}

	while (GL_NO_ERROR != gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}